

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

String * __thiscall
kj::encodeBase64(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> input,
                bool breakLines)

{
  kj kVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  size_t sVar10;
  kj *pkVar11;
  ulong uVar12;
  Fault f;
  size_t total;
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition;
  size_t local_28;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = input.ptr + 2;
  sVar10 = SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
  if ((int)input.size_ != 0) {
    sVar10 = sVar10 + ((uint)(0x38e38e38e38e38e <
                             (sVar10 * -0x71c71c71c71c71c7 >> 3 |
                             sVar10 * -0x71c71c71c71c71c7 << 0x3d)) + (int)(sVar10 / 0x48));
  }
  heapString(__return_storage_ptr__,sVar10);
  pcVar3 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (__return_storage_ptr__->content).ptr;
  }
  if (((undefined1  [16])input & (undefined1  [16])0xffffffff) == (undefined1  [16])0x0) {
    iVar4 = 0;
    iVar9 = 0;
    uVar12 = 0;
    iVar5 = (int)pcVar3;
  }
  else {
    pkVar11 = this + (int)input.ptr;
    iVar4 = 0;
    pcVar6 = pcVar3;
    do {
      kVar1 = *this;
      *pcVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(byte)kVar1 >> 2]
      ;
      uVar12 = (ulong)(((byte)kVar1 & 3) << 4);
      if (this + 1 == pkVar11) {
        pcVar6 = pcVar6 + 1;
        iVar9 = 1;
        goto LAB_00184151;
      }
      kVar1 = this[1];
      pcVar6[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(byte)kVar1 >> 4 | uVar12];
      uVar12 = (ulong)(((byte)kVar1 & 0xf) << 2);
      if (this + 2 == pkVar11) {
        pcVar6 = pcVar6 + 2;
        iVar9 = 2;
        goto LAB_00184151;
      }
      kVar1 = this[2];
      pcVar6[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(byte)kVar1 >> 6 | uVar12];
      uVar12 = (ulong)((byte)kVar1 & 0x3f);
      pcVar6[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar12];
      iVar4 = iVar4 + 1;
      if ((iVar4 == 0x12 & (byte)input.size_) == 1) {
        pcVar6[4] = '\n';
        pcVar6 = pcVar6 + 5;
        iVar4 = 0;
      }
      else {
        pcVar6 = pcVar6 + 4;
      }
      this = this + 3;
    } while (this != pkVar11);
    iVar9 = 0;
LAB_00184151:
    iVar5 = (int)pcVar6;
  }
  lVar7 = (long)(iVar5 - (int)pcVar3);
  pcVar3 = pcVar3 + lVar7;
  if (iVar9 == 2) {
    pcVar6 = pcVar3 + 1;
    *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar12];
    lVar8 = 2;
  }
  else {
    pcVar6 = pcVar3;
    if (iVar9 != 1) goto LAB_001841a9;
    *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar12];
    pcVar6 = pcVar3 + 2;
    pcVar3[1] = '=';
    lVar8 = 3;
  }
  *pcVar6 = '=';
  iVar4 = iVar4 + 1;
  pcVar6 = pcVar3 + lVar8;
LAB_001841a9:
  if (((byte)input.size_ != 0) && (0 < iVar4)) {
    *pcVar6 = '\n';
    pcVar6 = pcVar6 + 1;
  }
  _kjCondition.left = &total;
  total = ((int)pcVar6 - (int)pcVar3) + lVar7;
  sVar10 = (__return_storage_ptr__->content).size_;
  _kjCondition.right = 0;
  if (sVar10 != 0) {
    _kjCondition.right = sVar10 - 1;
  }
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = total == _kjCondition.right;
  if (!_kjCondition.result) {
    local_28 = _kjCondition.right;
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&,unsigned_long&,unsigned_long>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding.c++"
               ,0x351,FAILED,"total == output.size()","_kjCondition,total, output.size()",
               &_kjCondition,_kjCondition.left,&local_28);
    _::Debug::Fault::fatal(&f);
  }
  return __return_storage_ptr__;
}

Assistant:

String encodeBase64(ArrayPtr<const byte> input, bool breakLines) {
  /* set up a destination buffer large enough to hold the encoded data */
  // equivalent to ceil(input.size() / 3) * 4
  auto numChars = (input.size() + 2) / 3 * 4;
  if (breakLines) {
    // Add space for newline characters.
    uint lineCount = numChars / CHARS_PER_LINE;
    if (numChars % CHARS_PER_LINE > 0) {
      // Partial line.
      ++lineCount;
    }
    numChars = numChars + lineCount;
  }
  auto output = heapString(numChars);
  /* keep track of our encoded position */
  char* c = output.begin();
  /* store the number of bytes encoded by a single call */
  int cnt = 0;
  size_t total = 0;
  /* we need an encoder state */
  base64_encodestate s;

  /*---------- START ENCODING ----------*/
  /* initialise the encoder state */
  base64_init_encodestate(&s);
  /* gather data from the input and send it to the output */
  cnt = base64_encode_block((const char *)input.begin(), input.size(), c, &s, breakLines);
  c += cnt;
  total += cnt;

  /* since we have encoded the entire input string, we know that
     there is no more input data; finalise the encoding */
  cnt = base64_encode_blockend(c, &s, breakLines);
  c += cnt;
  total += cnt;
  /*---------- STOP ENCODING  ----------*/

  KJ_ASSERT(total == output.size(), total, output.size());

  return output;
}